

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FinalParser.cpp
# Opt level: O0

MiddleVal * __thiscall FinalParser::term(MiddleVal *__return_storage_ptr__,FinalParser *this)

{
  bool bVar1;
  bool local_13a;
  string local_120;
  MiddleVal local_100;
  allocator local_c9;
  string local_c8;
  MiddleVal local_a8;
  allocator local_71;
  string local_70;
  undefined1 local_40 [8];
  string tk;
  FinalParser *this_local;
  MiddleVal *temp;
  
  tk.field_2._M_local_buf[0xf] = '\0';
  factor(__return_storage_ptr__,this);
  getnow_abi_cxx11_((string *)local_40,this);
  while( true ) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"*");
    local_13a = true;
    if (!bVar1) {
      local_13a = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"/");
    }
    if (local_13a == false) break;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"*");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_70,"*",&local_71);
      match(this,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      factor(&local_a8,this);
      MiddleVal::operator*=(__return_storage_ptr__,&local_a8);
      MiddleVal::~MiddleVal(&local_a8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c8,"/",&local_c9);
      match(this,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      factor(&local_100,this);
      MiddleVal::operator/=(__return_storage_ptr__,&local_100);
      MiddleVal::~MiddleVal(&local_100);
    }
    getnow_abi_cxx11_(&local_120,this);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
  }
  tk.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_40);
  if ((tk.field_2._M_local_buf[0xf] & 1U) == 0) {
    MiddleVal::~MiddleVal(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MiddleVal FinalParser::term() {
    MiddleVal temp = factor();
    std::string tk = getnow();
    while (tk == "*" || tk == "/") {
        if (tk == "*") {
            match("*");
            temp *= factor();
        } else {
            match("/");
            temp /= factor();
        }
        tk = getnow();
    }
    return temp;
}